

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O3

BZFILE * bzopen_or_bzdopen(char *path,int fd,char *mode,int open_mode)

{
  byte bVar1;
  int iVar2;
  ushort **ppuVar3;
  size_t sVar4;
  FILE *__stream;
  undefined8 *puVar5;
  BZFILE *pBVar6;
  bool bVar7;
  int iVar8;
  char mode2 [10];
  int bzerr;
  char unused [5000];
  short local_13d8 [8];
  int local_13c8;
  int local_13c4;
  char *local_13c0;
  undefined1 local_13b8 [5000];
  
  local_13d8[4] = 0;
  local_13d8[0] = 0;
  local_13d8[1] = 0;
  local_13d8[2] = 0;
  local_13d8[3] = 0;
  bVar7 = false;
  if (mode == (char *)0x0) {
    return (BZFILE *)0x0;
  }
  iVar8 = 9;
  iVar2 = 0;
  local_13c8 = fd;
  local_13c0 = path;
  do {
    bVar1 = *mode;
    if (bVar1 < 0x73) {
      if (bVar1 == 0x72) {
        bVar7 = false;
      }
      else {
        if (bVar1 == 0) {
          sVar4 = strlen((char *)local_13d8);
          *(ushort *)((long)local_13d8 + sVar4) = (ushort)bVar7 * 5 + 0x72;
          sVar4 = strlen((char *)local_13d8);
          *(undefined2 *)((long)local_13d8 + sVar4) = 0x62;
          if (open_mode == 0) {
            if ((local_13c0 == (char *)0x0) || (*local_13c0 == '\0')) {
              if (bVar7) {
                puVar5 = (undefined8 *)&stdout;
              }
              else {
                puVar5 = (undefined8 *)&stdin;
              }
              __stream = (FILE *)*puVar5;
            }
            else {
              __stream = fopen64(local_13c0,(char *)local_13d8);
            }
          }
          else {
            __stream = fdopen(local_13c8,(char *)local_13d8);
          }
          if (__stream != (FILE *)0x0) {
            if (bVar7) {
              iVar2 = 1;
              if (1 < iVar8) {
                iVar2 = iVar8;
              }
              iVar8 = 9;
              if (iVar2 < 9) {
                iVar8 = iVar2;
              }
              pBVar6 = BZ2_bzWriteOpen(&local_13c4,(FILE *)__stream,iVar8,0,0x1e);
            }
            else {
              pBVar6 = BZ2_bzReadOpen(&local_13c4,(FILE *)__stream,0,iVar2,local_13b8,0);
            }
            if (pBVar6 != (BZFILE *)0x0) {
              return pBVar6;
            }
            if (__stream == _stdin) {
              return (BZFILE *)0x0;
            }
            if (__stream == _stdout) {
              return (BZFILE *)0x0;
            }
            fclose(__stream);
          }
          return (BZFILE *)0x0;
        }
LAB_004eccd3:
        ppuVar3 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar3 + (long)(int)(char)bVar1 * 2 + 1) & 8) != 0) {
          iVar8 = (char)bVar1 + -0x30;
        }
      }
    }
    else if (bVar1 == 0x73) {
      iVar2 = 1;
    }
    else {
      if (bVar1 != 0x77) goto LAB_004eccd3;
      bVar7 = true;
    }
    mode = (char *)((byte *)mode + 1);
  } while( true );
}

Assistant:

static
BZFILE * bzopen_or_bzdopen
               ( const char *path,   /* no use when bzdopen */
                 int fd,             /* no use when bzdopen */
                 const char *mode,
                 int open_mode)      /* bzopen: 0, bzdopen:1 */
{
   int    bzerr;
   char   unused[BZ_MAX_UNUSED];
   int    blockSize100k = 9;
   int    writing       = 0;
   char   mode2[10]     = "";
   FILE   *fp           = NULL;
   BZFILE *bzfp         = NULL;
   int    verbosity     = 0;
   int    workFactor    = 30;
   int    smallMode     = 0;
   int    nUnused       = 0; 

   if (mode == NULL) return NULL;
   while (*mode) {
      switch (*mode) {
      case 'r':
         writing = 0; break;
      case 'w':
         writing = 1; break;
      case 's':
         smallMode = 1; break;
      default:
         if (isdigit((int)(*mode))) {
            blockSize100k = *mode-BZ_HDR_0;
         }
      }
      mode++;
   }
   strcat(mode2, writing ? "w" : "r" );
   strcat(mode2,"b");   /* binary mode */

   if (open_mode==0) {
      if (path==NULL || strcmp(path,"")==0) {
        fp = (writing ? stdout : stdin);
        SET_BINARY_MODE(fp);
      } else {
        fp = fopen(path,mode2);
      }
   } else {
#ifdef BZ_STRICT_ANSI
      fp = NULL;
#else
      fp = fdopen(fd,mode2);
#endif
   }
   if (fp == NULL) return NULL;

   if (writing) {
      /* Guard against total chaos and anarchy -- JRS */
      if (blockSize100k < 1) blockSize100k = 1;
      if (blockSize100k > 9) blockSize100k = 9; 
      bzfp = BZ2_bzWriteOpen(&bzerr,fp,blockSize100k,
                             verbosity,workFactor);
   } else {
      bzfp = BZ2_bzReadOpen(&bzerr,fp,verbosity,smallMode,
                            unused,nUnused);
   }
   if (bzfp == NULL) {
      if (fp != stdin && fp != stdout) fclose(fp);
      return NULL;
   }
   return bzfp;
}